

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

PowBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_powbroadcastable(NeuralNetworkLayer *this)

{
  PowBroadcastableLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x375) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x375;
    this_00 = (PowBroadcastableLayerParams *)operator_new(0x18);
    PowBroadcastableLayerParams::PowBroadcastableLayerParams(this_00);
    (this->layer_).powbroadcastable_ = this_00;
  }
  return (PowBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PowBroadcastableLayerParams* NeuralNetworkLayer::mutable_powbroadcastable() {
  if (!has_powbroadcastable()) {
    clear_layer();
    set_has_powbroadcastable();
    layer_.powbroadcastable_ = new ::CoreML::Specification::PowBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.powBroadcastable)
  return layer_.powbroadcastable_;
}